

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnrealLoader.cpp
# Opt level: O1

void __thiscall
Assimp::UnrealImporter::InternReadFile
          (UnrealImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  float *pfVar1;
  int8_t **ppiVar2;
  char *__s;
  undefined1 uVar3;
  uint uVar4;
  size_t __n;
  bool bVar5;
  _Alloc_hider _Var6;
  aiMatrix4x4 *paVar7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar8;
  MeshFlags *pMVar9;
  float fVar10;
  SharedPostProcessInfo *pSVar11;
  char cVar12;
  uchar uVar13;
  byte bVar14;
  ushort uVar15;
  ushort uVar16;
  short sVar17;
  uint i_2;
  int iVar18;
  int iVar19;
  uint uVar20;
  Logger *pLVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar22;
  undefined4 extraout_var_02;
  aiNode *this_01;
  IOStream *stream;
  pointer __s2;
  __normal_iterator<Assimp::Unreal::TempMat_*,_std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>_>
  _Var23;
  aiMesh **ppaVar24;
  aiMaterial **ppaVar25;
  uint *puVar26;
  aiMesh *paVar27;
  ulong *puVar28;
  aiFace *paVar29;
  aiVector3D *paVar30;
  aiMaterial *this_02;
  size_t sVar31;
  pointer ppVar32;
  runtime_error *prVar33;
  char cVar34;
  float *pfVar35;
  aiFace *paVar36;
  aiVector3t<float> *vertex;
  pointer paVar37;
  pointer pTVar38;
  pointer pTVar39;
  uint i2;
  uchar (*pauVar40) [2];
  long lVar41;
  pointer pTVar42;
  aiMatrix4x4 *c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_03;
  uint i_1;
  ulong uVar43;
  ulong uVar44;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar45;
  uint i;
  long lVar46;
  uchar (*pauVar47) [2];
  int twosided;
  vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> materials;
  FlipWindingOrderProcess flipper;
  string uc_path;
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  textures;
  vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> triangles;
  string extension;
  StreamReaderLE d_reader;
  string a_path;
  string d_path;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertices;
  MakeLeftHandedProcess hero;
  StreamReaderLE a_reader;
  undefined4 local_5cc;
  vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> local_5c8;
  FlipWindingOrderProcess local_5a8;
  char *local_588;
  long local_580;
  char local_578 [16];
  aiNode *local_568;
  aiMatrix4x4 *local_560;
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_558;
  vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> local_538;
  string local_520;
  StreamReader<false,_false> local_500;
  char *local_4c8;
  long local_4c0;
  char local_4b8 [16];
  char *local_4a8;
  long local_4a0;
  char local_498 [16];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_488;
  undefined1 local_470 [12];
  char acStack_464 [4];
  undefined1 local_460 [24];
  size_type local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440 [4];
  ios_base local_400 [920];
  StreamReader<false,_false> local_68;
  undefined4 extraout_var_01;
  undefined4 extraout_var_03;
  
  std::__cxx11::string::rfind((char)pFile,0x2e);
  BaseImporter::GetExtension(&local_520,pFile);
  local_4a8 = local_498;
  local_4a0 = 0;
  local_498[0] = '\0';
  local_4c8 = local_4b8;
  local_4c0 = 0;
  local_4b8[0] = '\0';
  local_588 = local_578;
  local_580 = 0;
  local_578[0] = '\0';
  iVar18 = std::__cxx11::string::compare((char *)&local_520);
  if (iVar18 == 0) {
    lVar46 = std::__cxx11::string::rfind((char)pFile,0x5f);
    if (lVar46 == -1) {
      prVar33 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_470._0_8_ = local_460;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_470,"UNREAL: Unexpected naming scheme","");
      std::runtime_error::runtime_error(prVar33,(string *)local_470);
      *(undefined ***)prVar33 = &PTR__runtime_error_0081d260;
      __cxa_throw(prVar33,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::substr((ulong)local_470,(ulong)pFile);
  }
  else {
    std::__cxx11::string::substr((ulong)local_470,(ulong)pFile);
  }
  std::__cxx11::string::operator=((string *)&local_520,(string *)local_470);
  if ((undefined1 *)CONCAT44(local_470._4_4_,local_470._0_4_) != local_460) {
    operator_delete((undefined1 *)CONCAT44(local_470._4_4_,local_470._0_4_));
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_470,local_520._M_dataplus._M_p,
             local_520._M_dataplus._M_p + local_520._M_string_length);
  std::__cxx11::string::append(local_470);
  std::__cxx11::string::operator=((string *)&local_4a8,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_470,local_520._M_dataplus._M_p,
             local_520._M_dataplus._M_p + local_520._M_string_length);
  std::__cxx11::string::append(local_470);
  std::__cxx11::string::operator=((string *)&local_4c8,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_470,local_520._M_dataplus._M_p,
             local_520._M_dataplus._M_p + local_520._M_string_length);
  std::__cxx11::string::append(local_470);
  std::__cxx11::string::operator=((string *)&local_588,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  pLVar21 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470,
             (char (*) [22])"UNREAL: data file is ");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,local_4a8,local_4a0);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar21,(char *)local_500.stream.
                                super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
  ppiVar2 = &local_500.buffer;
  if (local_500.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)ppiVar2) {
    operator_delete(local_500.stream.
                    super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
  std::ios_base::~ios_base(local_400);
  pLVar21 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470,
             (char (*) [22])"UNREAL: aniv file is ");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,local_4c8,local_4c0);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar21,(char *)local_500.stream.
                                super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
  if (local_500.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)ppiVar2) {
    operator_delete(local_500.stream.
                    super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
  std::ios_base::~ios_base(local_400);
  pLVar21 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[20]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470,
             (char (*) [20])"UNREAL: uc file is ");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,local_588,local_580);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar21,(char *)local_500.stream.
                                super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
  if (local_500.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)ppiVar2) {
    operator_delete(local_500.stream.
                    super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
  std::ios_base::~ios_base(local_400);
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"rb","");
  iVar18 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,local_4a8,local_470._0_8_);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  if ((long *)CONCAT44(extraout_var,iVar18) == (long *)0x0) {
    prVar33 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: Unable to open _d file","");
    std::runtime_error::runtime_error(prVar33,(string *)local_470);
    *(undefined ***)prVar33 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar33,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"rb","");
  iVar19 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,local_4a8,local_470._0_8_);
  StreamReader<false,_false>::StreamReader
            (&local_500,(IOStream *)CONCAT44(extraout_var_00,iVar19),false);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  uVar15 = StreamReader<false,_false>::Get<short>(&local_500);
  uVar16 = StreamReader<false,_false>::Get<short>(&local_500);
  StreamReader<false,_false>::IncPtr(&local_500,0x2c);
  if ((uVar15 == 0) || (uVar16 < 3)) {
    prVar33 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: Invalid number of vertices/triangles","");
    std::runtime_error::runtime_error(prVar33,(string *)local_470);
    *(undefined ***)prVar33 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar33,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_560 = (aiMatrix4x4 *)CONCAT62(local_560._2_6_,uVar16);
  std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>::vector
            (&local_538,(ulong)uVar15,(allocator_type *)local_470);
  local_568 = (aiNode *)
              local_538.
              super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_538.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_538.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pauVar40 = (local_538.
                super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                ._M_impl.super__Vector_impl_data._M_start)->mTex;
    pTVar39 = local_538.
              super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      lVar46 = 0;
      do {
        uVar16 = StreamReader<false,_false>::Get<short>(&local_500);
        pTVar39->mVertex[lVar46] = uVar16;
        if (uVar15 <= uVar16) {
          pLVar21 = DefaultLogger::get();
          Logger::warn(pLVar21,"UNREAL: vertex index out of range");
          pTVar39->mVertex[lVar46] = 0;
        }
        lVar46 = lVar46 + 1;
      } while (lVar46 != 3);
      cVar12 = StreamReader<false,_false>::Get<signed_char>(&local_500);
      pTVar39->mType = cVar12;
      if (this->configHandleFlags == false) {
        cVar34 = '\x01';
        if ((byte)(cVar12 - 3U) < 2) goto LAB_0062b433;
      }
      else {
        cVar34 = '\0';
LAB_0062b433:
        pTVar39->mType = cVar34;
      }
      StreamReader<false,_false>::IncPtr(&local_500,1);
      lVar46 = 0;
      pauVar47 = pauVar40;
      do {
        lVar41 = 0;
        do {
          uVar13 = StreamReader<false,_false>::Get<signed_char>(&local_500);
          (*pauVar47)[lVar41] = uVar13;
          lVar41 = lVar41 + 1;
        } while (lVar41 == 1);
        lVar46 = lVar46 + 1;
        pauVar47 = pauVar47 + 1;
      } while (lVar46 != 3);
      uVar13 = StreamReader<false,_false>::Get<signed_char>(&local_500);
      pTVar39->mTextureNum = uVar13;
      StreamReader<false,_false>::IncPtr(&local_500,1);
      pTVar39 = pTVar39 + 1;
      pauVar40 = pauVar40 + 10;
    } while ((aiNode *)pTVar39 != local_568);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"rb","");
  iVar19 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,local_4c8,local_470._0_8_);
  plVar22 = (long *)CONCAT44(extraout_var_01,iVar19);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar18) + 8))();
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  if (plVar22 == (long *)0x0) {
    prVar33 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: Unable to open _a file","");
    std::runtime_error::runtime_error(prVar33,(string *)local_470);
    *(undefined ***)prVar33 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar33,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"rb","");
  iVar18 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,local_4c8,local_470._0_8_);
  StreamReader<false,_false>::StreamReader
            (&local_68,(IOStream *)CONCAT44(extraout_var_02,iVar18),false);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  sVar17 = StreamReader<false,_false>::Get<short>(&local_68);
  if ((uint)(int)sVar17 <= this->configFrameID) {
    prVar33 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: The requested frame does not exist","");
    std::runtime_error::runtime_error(prVar33,(string *)local_470);
    *(undefined ***)prVar33 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar33,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar17 = StreamReader<false,_false>::Get<short>(&local_68);
  uVar44 = (ulong)local_560 & 0xffff;
  if ((uint)(ushort)local_560 * 4 != (int)sVar17) {
    prVar33 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: Unexpected aniv file length","");
    std::runtime_error::runtime_error(prVar33,(string *)local_470);
    *(undefined ***)prVar33 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar33,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  StreamReader<false,_false>::IncPtr
            (&local_68,(ulong)(this->configFrameID * (uint)(ushort)local_560 * 4));
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            (&local_488,uVar44,(allocator_type *)local_470);
  if (local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar37 = local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      iVar18 = StreamReader<false,_false>::Get<int>(&local_68);
      paVar37->x = (float)((iVar18 << 0x15) >> 0x15);
      paVar37->y = (float)((iVar18 << 10) >> 0x15);
      paVar37->z = (float)(iVar18 >> 0x16);
      paVar37 = paVar37 + 1;
    } while (paVar37 !=
             local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_558.
  super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_558.
  super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_558.
  super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_01);
  pScene->mRootNode = this_01;
  (this_01->mName).length = 0xc;
  builtin_strncpy((this_01->mName).data,"<UnrealRoot>",0xd);
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"rb","");
  iVar18 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,local_588,local_470._0_8_);
  stream = (IOStream *)CONCAT44(extraout_var_03,iVar18);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  local_568 = this_01;
  if (stream == (IOStream *)0x0) {
    pLVar21 = DefaultLogger::get();
    Logger::error(pLVar21,"Unable to open .uc file");
  }
  else {
    local_5c8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_5c8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5c8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    BaseImporter::TextFileToBuffer
              (stream,(vector<char,_std::allocator<char>_> *)&local_5c8,FORBID_EMPTY);
    local_5a8.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x0;
    local_5a8.super_BaseProcess.shared = (SharedPostProcessInfo *)0x0;
    local_5a8.super_BaseProcess.progress = (ProgressHandler *)0x0;
    if ((char)(local_5c8.
               super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
               ._M_impl.super__Vector_impl_data._M_start)->type != MF_NORMAL_OS) {
      paVar7 = &local_568->mTransformation;
      pfVar1 = &(local_568->mTransformation).b2;
      local_560 = &local_568->mTransformation;
      pfVar35 = pfVar1;
      __s2 = local_5c8.
             super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
             _M_impl.super__Vector_impl_data._M_start;
      do {
        iVar18 = strncasecmp("#exec",(char *)__s2,5);
        if (iVar18 == 0) {
          pfVar35 = (float *)(ulong)*(byte *)((long)&__s2->tex + 1);
          bVar5 = false;
          if ((pfVar35 < (float *)0x21) && ((0x100003601U >> ((ulong)pfVar35 & 0x3f) & 1) != 0)) {
            __s2 = (pointer)((long)&__s2->tex + 2);
            bVar5 = true;
          }
        }
        else {
          bVar5 = false;
        }
        if (bVar5) {
          while ((uVar44 = (ulong)(byte)(char)__s2->type, uVar44 < 0x21 &&
                 ((0x100002600U >> (uVar44 & 0x3f) & 1) != 0))) {
            __s2 = (pointer)((long)&__s2->type + 1);
          }
          iVar18 = strncasecmp("TEXTURE",(char *)__s2,7);
          if (((iVar18 == 0) && (uVar44 = (ulong)*(byte *)((long)&__s2->tex + 3), uVar44 < 0x21)) &&
             ((0x100003601U >> (uVar44 & 0x3f) & 1) != 0)) {
            __s2 = (pointer)&__s2->numFaces;
            bVar5 = true;
          }
          else {
            bVar5 = false;
          }
          if (bVar5) {
            while ((uVar44 = (ulong)(byte)(char)__s2->type, uVar44 < 0x21 &&
                   ((0x100002600U >> (uVar44 & 0x3f) & 1) != 0))) {
              __s2 = (pointer)((long)&__s2->type + 1);
            }
            iVar18 = strncasecmp("IMPORT",(char *)__s2,6);
            if (((iVar18 == 0) && (uVar44 = (ulong)*(byte *)((long)&__s2->tex + 2), uVar44 < 0x21))
               && ((0x100003601U >> (uVar44 & 0x3f) & 1) != 0)) {
              __s2 = (pointer)((long)&__s2->tex + 3);
              bVar5 = true;
            }
            else {
              bVar5 = false;
            }
            if (bVar5) {
              local_470._8_4_ = 0;
              acStack_464[0] = '\0';
              acStack_464[1] = '\0';
              acStack_464[2] = '\0';
              acStack_464[3] = '\0';
              local_460._0_8_ = local_460._0_8_ & 0xffffffffffffff00;
              local_448 = 0;
              local_440[0]._M_local_buf[0] = '\0';
              local_460._16_8_ = local_440;
              local_470._0_8_ = local_460;
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)&local_5a8,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_470);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._16_8_ != local_440) {
                operator_delete((void *)local_460._16_8_);
              }
              if ((undefined1 *)local_470._0_8_ != local_460) {
                operator_delete((void *)local_470._0_8_);
              }
              pSVar11 = local_5a8.super_BaseProcess.shared;
              ppVar45 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)((long)local_5a8.super_BaseProcess.shared + -0x40);
              ppVar8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)((long)local_5a8.super_BaseProcess.shared + -0x40);
              while ((uVar20 = (uint)(byte)(char)__s2->type, 0xd < uVar20 ||
                     (pfVar35 = (float *)0x3401, (0x3401U >> (uVar20 & 0x1f) & 1) == 0))) {
                iVar18 = strncasecmp((char *)__s2,"NAME=",5);
                if (iVar18 == 0) {
                  pTVar42 = (pointer)((long)&__s2->tex + 1);
                  __s2 = pTVar42;
                  while ((uVar44 = (ulong)(byte)(char)__s2->type, 0x20 < uVar44 ||
                         ((0x100003601U >> (uVar44 & 0x3f) & 1) == 0))) {
                    __s2 = (pointer)((long)&__s2->type + 1);
                  }
                  local_470._0_8_ = local_460;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,pTVar42,__s2);
                  this_03 = ppVar45;
LAB_0062ba40:
                  std::__cxx11::string::operator=((string *)this_03,(string *)local_470);
                  if ((undefined1 *)local_470._0_8_ != local_460) {
                    operator_delete((void *)local_470._0_8_);
                  }
                }
                else {
                  iVar18 = strncasecmp((char *)__s2,"FILE=",5);
                  if (iVar18 == 0) {
                    pTVar42 = (pointer)((long)&__s2->tex + 1);
                    __s2 = pTVar42;
                    while ((uVar44 = (ulong)(byte)(char)__s2->type, 0x20 < uVar44 ||
                           ((0x100003601U >> (uVar44 & 0x3f) & 1) == 0))) {
                      __s2 = (pointer)((long)&__s2->type + 1);
                    }
                    local_470._0_8_ = local_460;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_470,pTVar42,__s2);
                    this_03 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&ppVar8->second;
                    goto LAB_0062ba40;
                  }
                }
                __s2 = (pointer)((long)&__s2->type + 1);
              }
              if (((((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)pSVar11 + -0x40))->first)._M_string_length == 0) ||
                 ((((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)pSVar11 + -0x40))->second)._M_string_length == 0)) {
                local_5a8.super_BaseProcess.shared =
                     (SharedPostProcessInfo *)((long)local_5a8.super_BaseProcess.shared + -0x40);
                __gnu_cxx::new_allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>::
                destroy<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((new_allocator<std::pair<std::__cxx11::string,std::__cxx11::string>> *)
                           &local_5a8,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_5a8.super_BaseProcess.shared);
              }
            }
          }
          else {
            iVar18 = strncasecmp("MESHMAP",(char *)__s2,7);
            if (iVar18 == 0) {
              pfVar35 = (float *)(ulong)*(byte *)((long)&__s2->tex + 3);
              bVar5 = false;
              if ((pfVar35 < (float *)0x21) && ((0x100003601U >> ((ulong)pfVar35 & 0x3f) & 1) != 0))
              {
                __s2 = (pointer)&__s2->numFaces;
                bVar5 = true;
              }
            }
            else {
              bVar5 = false;
            }
            if (bVar5) {
              while ((uVar44 = (ulong)(byte)(char)__s2->type, uVar44 < 0x21 &&
                     ((0x100002600U >> (uVar44 & 0x3f) & 1) != 0))) {
                __s2 = (pointer)((long)&__s2->type + 1);
              }
              iVar18 = strncasecmp("SETTEXTURE",(char *)__s2,10);
              if (((iVar18 == 0) &&
                  (uVar44 = (ulong)*(byte *)((long)&__s2->numFaces + 2), uVar44 < 0x21)) &&
                 ((0x100003601U >> (uVar44 & 0x3f) & 1) != 0)) {
                __s2 = (pointer)((long)&__s2->numFaces + 3);
                bVar5 = true;
              }
              else {
                bVar5 = false;
              }
              if (bVar5) {
                local_470._0_4_ = MF_NORMAL_OS;
                local_460._0_8_ = 0;
                local_460[8] = '\0';
                unique0x100031e0 = local_460 + 8;
                std::
                vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>
                ::emplace_back<std::pair<unsigned_int,std::__cxx11::string>>
                          ((vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>
                            *)&local_558,
                           (pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_470);
                if (stack0xfffffffffffffb98 != local_460 + 8) {
                  operator_delete(stack0xfffffffffffffb98);
                }
                ppVar32 = local_558.
                          super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                this_00 = &local_558.
                           super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].second;
                while ((uVar20 = (uint)(byte)(char)__s2->type, 0xd < uVar20 ||
                       (pfVar35 = (float *)0x3401, (0x3401U >> (uVar20 & 0x1f) & 1) == 0))) {
                  iVar18 = strncasecmp((char *)__s2,"NUM=",4);
                  if (iVar18 == 0) {
                    bVar14 = (byte)__s2->tex;
                    __s2 = (pointer)&__s2->tex;
                    uVar20 = 0;
                    if (0xf5 < (byte)(bVar14 - 0x3a)) {
                      uVar20 = 0;
                      do {
                        uVar20 = (uint)(byte)(bVar14 - 0x30) + uVar20 * 10;
                        bVar14 = *(byte *)((long)&__s2->type + 1);
                        __s2 = (pointer)((long)&__s2->type + 1);
                      } while (0xf5 < (byte)(bVar14 - 0x3a));
                    }
                    ppVar32[-1].first = uVar20;
                  }
                  else {
                    iVar18 = strncasecmp((char *)__s2,"TEXTURE=",8);
                    if (iVar18 == 0) {
                      puVar26 = &__s2->numFaces;
                      __s2 = (pointer)puVar26;
                      while ((uVar44 = (ulong)(byte)(char)__s2->type, 0x20 < uVar44 ||
                             ((0x100003601U >> (uVar44 & 0x3f) & 1) == 0))) {
                        __s2 = (pointer)((long)&__s2->type + 1);
                      }
                      local_470._0_8_ = local_460;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_470,puVar26,__s2);
                      std::__cxx11::string::operator=((string *)this_00,(string *)local_470);
                      if ((undefined1 *)local_470._0_8_ != local_460) {
                        operator_delete((void *)local_470._0_8_);
                      }
                      pSVar11 = local_5a8.super_BaseProcess.shared;
                      if ((SharedPostProcessInfo *)local_5a8.super_BaseProcess._vptr_BaseProcess !=
                          local_5a8.super_BaseProcess.shared) {
                        sVar31 = ppVar32[-1].second._M_string_length;
                        ppVar45 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_5a8.super_BaseProcess._vptr_BaseProcess;
                        do {
                          __n = (ppVar45->first)._M_string_length;
                          if (__n == sVar31) {
                            if (__n != 0) {
                              iVar18 = bcmp((ppVar45->first)._M_dataplus._M_p,
                                            (this_00->_M_dataplus)._M_p,__n);
                              if (iVar18 != 0) goto LAB_0062bc78;
                            }
                            std::__cxx11::string::_M_assign((string *)this_00);
                            break;
                          }
LAB_0062bc78:
                          ppVar45 = ppVar45 + 1;
                        } while (ppVar45 !=
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)pSVar11);
                      }
                    }
                  }
                  __s2 = (pointer)((long)&__s2->type + 1);
                }
              }
              else {
                iVar18 = strncasecmp("SCALE",(char *)__s2,5);
                if (iVar18 == 0) {
                  pfVar35 = (float *)(ulong)*(byte *)((long)&__s2->tex + 1);
                  bVar5 = false;
                  if ((pfVar35 < (float *)0x21) &&
                     ((0x100003601U >> ((ulong)pfVar35 & 0x3f) & 1) != 0)) {
                    __s2 = (pointer)((long)&__s2->tex + 2);
                    bVar5 = true;
                  }
                }
                else {
                  bVar5 = false;
                }
                if (bVar5) {
                  do {
                    uVar3 = (undefined1)__s2->type;
                    if ((byte)uVar3 < 0x59) {
                      if (uVar3 == 0x58) {
                        bVar14 = *(byte *)((long)&__s2->type + 1);
                        c = local_560;
                        goto joined_r0x0062bd36;
                      }
                      if (((byte)uVar3 < (MF_WEAPON_PLACEHOLDER|MF_NORMAL_MOD_TS|MF_NORMAL_TRANS_TS)
                          ) && (pfVar35 = (float *)0x3401,
                               (0x3401U >> ((byte)uVar3 & 0x1f) & 1) != 0)) break;
                    }
                    else {
                      if (uVar3 == 0x59) {
                        bVar14 = *(byte *)((long)&__s2->type + 1);
                        c = (aiMatrix4x4 *)pfVar1;
joined_r0x0062bd36:
                        if (bVar14 != 0x3d) goto joined_r0x0062bd65;
                      }
                      else {
joined_r0x0062bd65:
                        if (((byte)uVar3 != 0x5a) ||
                           (c = (aiMatrix4x4 *)&paVar7->c3, *(byte *)((long)&__s2->type + 1) != 0x3d
                           )) goto LAB_0062bd4c;
                      }
                      __s2 = (pointer)fast_atoreal_move<float>
                                                ((Assimp *)((long)&__s2->type + 2),(char *)c,
                                                 (float *)0x1,SUB81(pfVar35,0));
                    }
LAB_0062bd4c:
                    __s2 = (pointer)((long)&__s2->type + 1);
                  } while( true );
                }
              }
            }
          }
        }
        pMVar9 = &__s2->type;
        __s2 = (pointer)((long)&__s2->type + 1);
      } while (*(byte *)((long)pMVar9 + 1) != 0);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_5a8);
    this_01 = local_568;
    if (local_5c8.
        super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5c8.
                      super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      this_01 = local_568;
    }
  }
  local_5c8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5c8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
  _M_impl.super__Vector_impl_data._M_finish = (TempMat *)0x0;
  local_5c8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (TempMat *)0x0;
  std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::reserve
            (&local_5c8,
             ((long)local_558.
                    super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_558.
                    super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x6666666666666666 + 5);
  pTVar39 = local_538.
            super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (local_538.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_538.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pTVar38 = local_538.
              super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_470._0_4_ = SEXT14(pTVar38->mType);
      local_470._4_4_ = ZEXT14(pTVar38->mTextureNum);
      local_470._8_4_ = 0;
      _Var23 = std::
               __find_if<__gnu_cxx::__normal_iterator<Assimp::Unreal::TempMat*,std::vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::Unreal::TempMat_const>>
                         (local_5c8.
                          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          local_5c8.
                          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          ._M_impl.super__Vector_impl_data._M_finish,(TempMat *)local_470);
      if (_Var23._M_current ==
          local_5c8.
          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pTVar38->matIndex =
             (int)((ulong)((long)local_5c8.
                                 super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_5c8.
                                super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
        local_470._8_4_ = 1;
        if (local_5c8.
            super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_5c8.
            super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>>::
          _M_realloc_insert<Assimp::Unreal::TempMat_const&>
                    ((vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>> *)
                     &local_5c8,
                     (iterator)
                     local_5c8.
                     super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(TempMat *)local_470);
        }
        else {
          (local_5c8.
           super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
           _M_impl.super__Vector_impl_data._M_finish)->numFaces = 1;
          (local_5c8.
           super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
           _M_impl.super__Vector_impl_data._M_finish)->type = local_470._0_4_;
          (local_5c8.
           super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
           _M_impl.super__Vector_impl_data._M_finish)->tex = local_470._4_4_;
          local_5c8.
          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_5c8.
               super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pScene->mNumMeshes = pScene->mNumMeshes + 1;
      }
      else {
        pTVar38->matIndex =
             (int)((ulong)((long)_Var23._M_current -
                          (long)local_5c8.
                                super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
        (_Var23._M_current)->numFaces = (_Var23._M_current)->numFaces + 1;
      }
      pTVar38 = pTVar38 + 1;
    } while (pTVar38 != pTVar39);
  }
  uVar20 = pScene->mNumMeshes;
  uVar44 = (ulong)uVar20;
  if (uVar44 == 0) {
    prVar33 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: Unable to find valid mesh data","");
    std::runtime_error::runtime_error(prVar33,(string *)local_470);
    *(undefined ***)prVar33 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar33,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  ppaVar24 = (aiMesh **)operator_new__(uVar44 * 8);
  pScene->mMeshes = ppaVar24;
  pScene->mNumMaterials = uVar20;
  ppaVar25 = (aiMaterial **)operator_new__(uVar44 * 8);
  pScene->mMaterials = ppaVar25;
  this_01->mNumMeshes = uVar20;
  puVar26 = (uint *)operator_new__(uVar44 << 2);
  this_01->mMeshes = puVar26;
  _Var6._M_p = stack0xfffffffffffffb98;
  if (pScene->mNumMeshes != 0) {
    uVar44 = 0;
    do {
      unique0x10003238 = _Var6._M_p;
      paVar27 = (aiMesh *)operator_new(0x520);
      paVar27->mPrimitiveTypes = 0;
      paVar27->mNumVertices = 0;
      paVar27->mNumFaces = 0;
      memset(&paVar27->mVertices,0,0xcc);
      paVar27->mBones = (aiBone **)0x0;
      paVar27->mMaterialIndex = 0;
      (paVar27->mName).length = 0;
      (paVar27->mName).data[0] = '\0';
      memset((paVar27->mName).data + 1,0x1b,0x3ff);
      paVar27->mNumAnimMeshes = 0;
      paVar27->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar27->mMethod = 0;
      (paVar27->mAABB).mMin.x = 0.0;
      (paVar27->mAABB).mMin.y = 0.0;
      (paVar27->mAABB).mMin.z = 0.0;
      (paVar27->mAABB).mMax.x = 0.0;
      (paVar27->mAABB).mMax.y = 0.0;
      (paVar27->mAABB).mMax.z = 0.0;
      paVar27->mTextureCoords[0] = (aiVector3D *)0x0;
      paVar27->mTextureCoords[1] = (aiVector3D *)0x0;
      paVar27->mTextureCoords[2] = (aiVector3D *)0x0;
      paVar27->mTextureCoords[3] = (aiVector3D *)0x0;
      paVar27->mTextureCoords[4] = (aiVector3D *)0x0;
      paVar27->mTextureCoords[5] = (aiVector3D *)0x0;
      paVar27->mTextureCoords[6] = (aiVector3D *)0x0;
      paVar27->mTextureCoords[7] = (aiVector3D *)0x0;
      paVar27->mNumUVComponents[0] = 0;
      paVar27->mNumUVComponents[1] = 0;
      paVar27->mNumUVComponents[2] = 0;
      paVar27->mNumUVComponents[3] = 0;
      paVar27->mNumUVComponents[4] = 0;
      paVar27->mNumUVComponents[5] = 0;
      paVar27->mNumUVComponents[6] = 0;
      paVar27->mNumUVComponents[7] = 0;
      paVar27->mColors[0] = (aiColor4D *)0x0;
      paVar27->mColors[1] = (aiColor4D *)0x0;
      paVar27->mColors[2] = (aiColor4D *)0x0;
      paVar27->mColors[3] = (aiColor4D *)0x0;
      paVar27->mColors[4] = (aiColor4D *)0x0;
      paVar27->mColors[5] = (aiColor4D *)0x0;
      paVar27->mColors[6] = (aiColor4D *)0x0;
      paVar27->mColors[7] = (aiColor4D *)0x0;
      pScene->mMeshes[uVar44] = paVar27;
      paVar27->mPrimitiveTypes = 4;
      uVar20 = local_5c8.
               super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar44].numFaces;
      uVar43 = (ulong)uVar20;
      puVar28 = (ulong *)operator_new__(uVar43 * 0x10 + 8);
      *puVar28 = uVar43;
      paVar29 = (aiFace *)(puVar28 + 1);
      if (uVar43 != 0) {
        paVar36 = paVar29;
        do {
          paVar36->mNumIndices = 0;
          paVar36->mIndices = (uint *)0x0;
          paVar36 = paVar36 + 1;
        } while (paVar36 != paVar29 + uVar43);
      }
      paVar27->mFaces = paVar29;
      uVar43 = (ulong)(uVar20 * 3);
      paVar30 = (aiVector3D *)operator_new__(uVar43 * 0xc);
      if (uVar20 != 0) {
        memset(paVar30,0,((uVar43 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar27->mVertices = paVar30;
      paVar30 = (aiVector3D *)operator_new__(uVar43 * 0xc);
      if (uVar20 != 0) {
        memset(paVar30,0,((uVar43 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar27->mTextureCoords[0] = paVar30;
      local_568->mMeshes[uVar44] = (uint)uVar44;
      this_02 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_02);
      __s = local_470 + 4;
      pScene->mMaterials[uVar44] = this_02;
      local_5a8.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x3f8000003f800000;
      local_5a8.super_BaseProcess.shared =
           (SharedPostProcessInfo *)CONCAT44(local_5a8.super_BaseProcess.shared._4_4_,0x3f800000);
      local_470._0_4_ = MF_NORMAL_OS;
      local_470._4_4_ = local_470._4_4_ & 0xffffff00;
      memset(local_470 + 5,0x1b,0x3ff);
      snprintf(__s,0x400,"mat%u_tx%u_",uVar44 & 0xffffffff);
      if (local_5c8.
          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar44].type == MF_NORMAL_TS) {
        local_5cc = 1;
        aiMaterial::AddBinaryProperty(this_02,&local_5cc,4,"$mat.twosided",0,0,aiPTI_Integer);
        sVar31 = strlen(__s);
        *(undefined4 *)(local_470 + sVar31 + 4) = 0x5f7374;
      }
      else {
        sVar31 = strlen(__s);
        *(undefined4 *)(local_470 + sVar31 + 4) = 0x5f736f;
      }
      if (local_5c8.
          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar44].type == MF_NORMAL_TRANS_TS) {
        local_5cc = 0x3f666666;
        aiMaterial::AddBinaryProperty(this_02,&local_5cc,4,"$mat.opacity",0,0,aiPTI_Float);
        sVar31 = strlen(__s);
        builtin_strncpy(local_470 + sVar31 + 4,"tran",4);
      }
      else {
        sVar31 = strlen(__s);
        builtin_strncpy(local_470 + sVar31 + 4,"opaq",4);
      }
      *(undefined2 *)(local_470 + sVar31 + 8) = 0x5f;
      if (local_5c8.
          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar44].type == MF_WEAPON_PLACEHOLDER) {
        local_470._4_4_ = 0x61655724;
        unique0x10001b3b = (pointer)0x246761546e6f70;
        local_470._0_4_ = MF_WEAPON_PLACEHOLDER|MF_NORMAL_MASKED_TS;
        local_5a8.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x0;
        local_5a8.super_BaseProcess.shared =
             (SharedPostProcessInfo *)
             ((ulong)local_5a8.super_BaseProcess.shared & 0xffffffff00000000);
      }
      aiMaterial::AddBinaryProperty(this_02,&local_5a8,0xc,"$clr.diffuse",0,0,aiPTI_Float);
      sVar31 = strlen(__s);
      local_470._0_4_ = (undefined4)sVar31;
      aiMaterial::AddProperty(this_02,(aiString *)local_470,"?mat.name",0,0);
      _Var6._M_p = stack0xfffffffffffffb98;
      if (local_558.
          super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_558.
          super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ppVar32 = local_558.
                  super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (ppVar32->first ==
              local_5c8.
              super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar44].tex) {
            uVar43 = (ppVar32->second)._M_string_length;
            if (uVar43 < 0x400) {
              local_470._0_4_ = (undefined4)uVar43;
              memcpy(__s,(ppVar32->second)._M_dataplus._M_p,uVar43);
              local_470[uVar43 + 4] = 0;
            }
            aiMaterial::AddProperty(this_02,(aiString *)local_470,"$tex.file",1,0);
            _Var6._M_p = stack0xfffffffffffffb98;
            break;
          }
          ppVar32 = ppVar32 + 1;
        } while (ppVar32 !=
                 local_558.
                 super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      uVar44 = uVar44 + 1;
    } while (uVar44 < pScene->mNumMeshes);
  }
  acStack_464 = SUB84((ulong)_Var6._M_p >> 0x20,0);
  if (local_538.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_538.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pTVar39 = local_538.
              super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_470._0_4_ = SEXT14(pTVar39->mType);
      local_470._4_4_ = ZEXT14(pTVar39->mTextureNum);
      local_470._8_4_ = 0;
      _Var23 = std::
               __find_if<__gnu_cxx::__normal_iterator<Assimp::Unreal::TempMat*,std::vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::Unreal::TempMat_const>>
                         (local_5c8.
                          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          local_5c8.
                          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          ._M_impl.super__Vector_impl_data._M_finish,local_470);
      paVar27 = pScene->mMeshes
                [((ulong)((long)_Var23._M_current -
                         (long)local_5c8.
                               super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0xaaaaaaaaaaaaaab]
      ;
      paVar29 = paVar27->mFaces;
      uVar20 = paVar27->mNumFaces;
      paVar27->mNumFaces = uVar20 + 1;
      paVar29[uVar20].mNumIndices = 3;
      puVar26 = (uint *)operator_new__(0xc);
      _Var6._M_p = (pointer)CONCAT44(acStack_464,local_470._8_4_);
      paVar29[uVar20].mIndices = puVar26;
      lVar46 = 0;
      do {
        paVar29[uVar20].mIndices[lVar46] = paVar27->mNumVertices;
        uVar15 = pTVar39->mVertex[lVar46];
        paVar30 = paVar27->mVertices;
        uVar4 = paVar27->mNumVertices;
        paVar30[uVar4].z =
             local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar15].z;
        fVar10 = local_488.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar15].y;
        paVar30 = paVar30 + uVar4;
        paVar30->x = local_488.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar15].x;
        paVar30->y = fVar10;
        bVar14 = pTVar39->mTex[lVar46][1];
        paVar30 = paVar27->mTextureCoords[0];
        uVar4 = paVar27->mNumVertices;
        paVar30[uVar4].x = (float)pTVar39->mTex[lVar46][0] / 255.0;
        paVar30[uVar4].y = 1.0 - (float)bVar14 / 255.0;
        paVar30[uVar4].z = 0.0;
        lVar46 = lVar46 + 1;
        paVar27->mNumVertices = paVar27->mNumVertices + 1;
      } while (lVar46 != 3);
      pTVar39 = pTVar39 + 1;
    } while (pTVar39 !=
             local_538.
             super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  unique0x10003218 = _Var6._M_p;
  MakeLeftHandedProcess::MakeLeftHandedProcess((MakeLeftHandedProcess *)local_470);
  MakeLeftHandedProcess::Execute((MakeLeftHandedProcess *)local_470,pScene);
  FlipWindingOrderProcess::FlipWindingOrderProcess(&local_5a8);
  FlipWindingOrderProcess::Execute(&local_5a8,pScene);
  FlipWindingOrderProcess::~FlipWindingOrderProcess(&local_5a8);
  MakeLeftHandedProcess::~MakeLeftHandedProcess((MakeLeftHandedProcess *)local_470);
  if (local_5c8.
      super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5c8.
                    super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (stream != (IOStream *)0x0) {
    (*stream->_vptr_IOStream[1])(stream);
  }
  std::
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_558);
  if (local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  StreamReader<false,_false>::~StreamReader(&local_68);
  if (local_538.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_538.
                    super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  StreamReader<false,_false>::~StreamReader(&local_500);
  (**(code **)(*plVar22 + 8))(plVar22);
  if (local_588 != local_578) {
    operator_delete(local_588);
  }
  if (local_4c8 != local_4b8) {
    operator_delete(local_4c8);
  }
  if (local_4a8 != local_498) {
    operator_delete(local_4a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p);
  }
  return;
}

Assistant:

void UnrealImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    // For any of the 3 files being passed get the three correct paths
    // First of all, determine file extension
    std::string::size_type pos = pFile.find_last_of('.');
    std::string extension = GetExtension(pFile);

    std::string d_path,a_path,uc_path;
    if (extension == "3d")      {
        // jjjj_d.3d
        // jjjj_a.3d
        pos = pFile.find_last_of('_');
        if (std::string::npos == pos) {
            throw DeadlyImportError("UNREAL: Unexpected naming scheme");
        }
        extension = pFile.substr(0,pos);
    }
    else {
        extension = pFile.substr(0,pos);
    }

    // build proper paths
    d_path  = extension+"_d.3d";
    a_path  = extension+"_a.3d";
    uc_path = extension+".uc";

    ASSIMP_LOG_DEBUG_F( "UNREAL: data file is ", d_path);
    ASSIMP_LOG_DEBUG_F("UNREAL: aniv file is ", a_path);
    ASSIMP_LOG_DEBUG_F("UNREAL: uc file is ", uc_path);

    // and open the files ... we can't live without them
    std::unique_ptr<IOStream> p(pIOHandler->Open(d_path));
    if (!p)
        throw DeadlyImportError("UNREAL: Unable to open _d file");
    StreamReaderLE d_reader(pIOHandler->Open(d_path));

    const uint16_t numTris = d_reader.GetI2();
    const uint16_t numVert = d_reader.GetI2();
    d_reader.IncPtr(44);
    if (!numTris || numVert < 3)
        throw DeadlyImportError("UNREAL: Invalid number of vertices/triangles");

    // maximum texture index
    unsigned int maxTexIdx = 0;

    // collect triangles
    std::vector<Unreal::Triangle> triangles(numTris);
    for (auto & tri : triangles) {
        for (unsigned int i = 0; i < 3;++i) {

            tri.mVertex[i] = d_reader.GetI2();
            if (tri.mVertex[i] >= numTris)  {
                ASSIMP_LOG_WARN("UNREAL: vertex index out of range");
                tri.mVertex[i] = 0;
            }
        }
        tri.mType = d_reader.GetI1();

        // handle mesh flagss?
        if (configHandleFlags)
            tri.mType = Unreal::MF_NORMAL_OS;
        else {
            // ignore MOD and MASKED for the moment, treat them as two-sided
            if (tri.mType == Unreal::MF_NORMAL_MOD_TS || tri.mType == Unreal::MF_NORMAL_MASKED_TS)
                tri.mType = Unreal::MF_NORMAL_TS;
        }
        d_reader.IncPtr(1);

        for (unsigned int i = 0; i < 3;++i)
            for (unsigned int i2 = 0; i2 < 2;++i2)
                tri.mTex[i][i2] = d_reader.GetI1();

        tri.mTextureNum = d_reader.GetI1();
        maxTexIdx = std::max(maxTexIdx,(unsigned int)tri.mTextureNum);
        d_reader.IncPtr(1);
    }

    p.reset(pIOHandler->Open(a_path));
    if (!p)
        throw DeadlyImportError("UNREAL: Unable to open _a file");
    StreamReaderLE a_reader(pIOHandler->Open(a_path));

    // read number of frames
    const uint32_t numFrames = a_reader.GetI2();
    if (configFrameID >= numFrames)
        throw DeadlyImportError("UNREAL: The requested frame does not exist");

    uint32_t st = a_reader.GetI2();
    if (st != numVert*4)
        throw DeadlyImportError("UNREAL: Unexpected aniv file length");

    // skip to our frame
    a_reader.IncPtr(configFrameID *numVert*4);

    // collect vertices
    std::vector<aiVector3D> vertices(numVert);
    for (auto &vertex : vertices)    {
        int32_t val = a_reader.GetI4();
        Unreal::DecompressVertex(vertex ,val);
    }

    // list of textures.
    std::vector< std::pair<unsigned int, std::string> > textures;

    // allocate the output scene
    aiNode* nd = pScene->mRootNode = new aiNode();
    nd->mName.Set("<UnrealRoot>");

    // we can live without the uc file if necessary
    std::unique_ptr<IOStream> pb (pIOHandler->Open(uc_path));
    if (pb.get())   {

        std::vector<char> _data;
        TextFileToBuffer(pb.get(),_data);
        const char* data = &_data[0];

        std::vector< std::pair< std::string,std::string > > tempTextures;

        // do a quick search in the UC file for some known, usually texture-related, tags
        for (;*data;++data) {
            if (TokenMatchI(data,"#exec",5))    {
                SkipSpacesAndLineEnd(&data);

                // #exec TEXTURE IMPORT [...] NAME=jjjjj [...] FILE=jjjj.pcx [...]
                if (TokenMatchI(data,"TEXTURE",7))  {
                    SkipSpacesAndLineEnd(&data);

                    if (TokenMatchI(data,"IMPORT",6))   {
                        tempTextures.push_back(std::pair< std::string,std::string >());
                        std::pair< std::string,std::string >& me = tempTextures.back();
                        for (;!IsLineEnd(*data);++data) {
                            if (!::ASSIMP_strincmp(data,"NAME=",5)) {
                                const char *d = data+=5;
                                for (;!IsSpaceOrNewLine(*data);++data);
                                me.first = std::string(d,(size_t)(data-d));
                            }
                            else if (!::ASSIMP_strincmp(data,"FILE=",5))    {
                                const char *d = data+=5;
                                for (;!IsSpaceOrNewLine(*data);++data);
                                me.second = std::string(d,(size_t)(data-d));
                            }
                        }
                        if (!me.first.length() || !me.second.length())
                            tempTextures.pop_back();
                    }
                }
                // #exec MESHMAP SETTEXTURE MESHMAP=box NUM=1 TEXTURE=Jtex1
                // #exec MESHMAP SCALE MESHMAP=box X=0.1 Y=0.1 Z=0.2
                else if (TokenMatchI(data,"MESHMAP",7)) {
                    SkipSpacesAndLineEnd(&data);

                    if (TokenMatchI(data,"SETTEXTURE",10)) {

                        textures.push_back(std::pair<unsigned int, std::string>());
                        std::pair<unsigned int, std::string>& me = textures.back();

                        for (;!IsLineEnd(*data);++data) {
                            if (!::ASSIMP_strincmp(data,"NUM=",4))  {
                                data += 4;
                                me.first = strtoul10(data,&data);
                            }
                            else if (!::ASSIMP_strincmp(data,"TEXTURE=",8)) {
                                data += 8;
                                const char *d = data;
                                for (;!IsSpaceOrNewLine(*data);++data);
                                me.second = std::string(d,(size_t)(data-d));

                                // try to find matching path names, doesn't care if we don't find them
                                for (std::vector< std::pair< std::string,std::string > >::const_iterator it = tempTextures.begin();
                                     it != tempTextures.end(); ++it)    {
                                    if ((*it).first == me.second)   {
                                        me.second = (*it).second;
                                        break;
                                    }
                                }
                            }
                        }
                    }
                    else if (TokenMatchI(data,"SCALE",5)) {

                        for (;!IsLineEnd(*data);++data) {
                            if (data[0] == 'X' && data[1] == '=')   {
                                data = fast_atoreal_move<float>(data+2,(float&)nd->mTransformation.a1);
                            }
                            else if (data[0] == 'Y' && data[1] == '=')  {
                                data = fast_atoreal_move<float>(data+2,(float&)nd->mTransformation.b2);
                            }
                            else if (data[0] == 'Z' && data[1] == '=')  {
                                data = fast_atoreal_move<float>(data+2,(float&)nd->mTransformation.c3);
                            }
                        }
                    }
                }
            }
        }
    }
    else    {
        ASSIMP_LOG_ERROR("Unable to open .uc file");
    }

    std::vector<Unreal::TempMat> materials;
    materials.reserve(textures.size()*2+5);

    // find out how many output meshes and materials we'll have and build material indices
	for (Unreal::Triangle &tri : triangles) {
        Unreal::TempMat mat(tri);
        std::vector<Unreal::TempMat>::iterator nt = std::find(materials.begin(),materials.end(),mat);
        if (nt == materials.end()) {
            // add material
            tri.matIndex = static_cast<unsigned int>(materials.size());
            mat.numFaces = 1;
            materials.push_back(mat);

            ++pScene->mNumMeshes;
        }
        else {
            tri.matIndex = static_cast<unsigned int>(nt-materials.begin());
            ++nt->numFaces;
        }
    }

    if (!pScene->mNumMeshes) {
        throw DeadlyImportError("UNREAL: Unable to find valid mesh data");
    }

    // allocate meshes and bind them to the node graph
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials = pScene->mNumMeshes];

    nd->mNumMeshes  = pScene->mNumMeshes;
    nd->mMeshes = new unsigned int[nd->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aiMesh* m = pScene->mMeshes[i] =  new aiMesh();
        m->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        const unsigned int num = materials[i].numFaces;
        m->mFaces            = new aiFace     [num];
        m->mVertices         = new aiVector3D [num*3];
        m->mTextureCoords[0] = new aiVector3D [num*3];

        nd->mMeshes[i] = i;

        // create materials, too
        aiMaterial* mat = new aiMaterial();
        pScene->mMaterials[i] = mat;

        // all white by default - texture rulez
        aiColor3D color(1.f,1.f,1.f);

        aiString s;
        ::ai_snprintf( s.data, MAXLEN, "mat%u_tx%u_",i,materials[i].tex );

        // set the two-sided flag
        if (materials[i].type == Unreal::MF_NORMAL_TS) {
            const int twosided = 1;
            mat->AddProperty(&twosided,1,AI_MATKEY_TWOSIDED);
            ::strcat(s.data,"ts_");
        }
        else ::strcat(s.data,"os_");

        // make TRANS faces 90% opaque that RemRedundantMaterials won't catch us
        if (materials[i].type == Unreal::MF_NORMAL_TRANS_TS)    {
            const float opac = 0.9f;
            mat->AddProperty(&opac,1,AI_MATKEY_OPACITY);
            ::strcat(s.data,"tran_");
        }
        else ::strcat(s.data,"opaq_");

        // a special name for the weapon attachment point
        if (materials[i].type == Unreal::MF_WEAPON_PLACEHOLDER) {
            s.length = ::ai_snprintf( s.data, MAXLEN, "$WeaponTag$" );
            color = aiColor3D(0.f,0.f,0.f);
        }

        // set color and name
        mat->AddProperty(&color,1,AI_MATKEY_COLOR_DIFFUSE);
        s.length = ::strlen(s.data);
        mat->AddProperty(&s,AI_MATKEY_NAME);

        // set texture, if any
        const unsigned int tex = materials[i].tex;
        for (std::vector< std::pair< unsigned int, std::string > >::const_iterator it = textures.begin();it != textures.end();++it) {
            if ((*it).first == tex) {
                s.Set((*it).second);
                mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(0));
                break;
            }
        }
    }

    // fill them.
    for (const Unreal::Triangle &tri : triangles) {
        Unreal::TempMat mat(tri);
        std::vector<Unreal::TempMat>::iterator nt = std::find(materials.begin(),materials.end(),mat);

        aiMesh* mesh = pScene->mMeshes[nt-materials.begin()];
        aiFace& f    = mesh->mFaces[mesh->mNumFaces++];
        f.mIndices   = new unsigned int[f.mNumIndices = 3];

        for (unsigned int i = 0; i < 3;++i,mesh->mNumVertices++) {
            f.mIndices[i] = mesh->mNumVertices;

            mesh->mVertices[mesh->mNumVertices] = vertices[ tri.mVertex[i] ];
            mesh->mTextureCoords[0][mesh->mNumVertices] = aiVector3D( tri.mTex[i][0] / 255.f, 1.f - tri.mTex[i][1] / 255.f, 0.f);
        }
    }

    // convert to RH
    MakeLeftHandedProcess hero;
    hero.Execute(pScene);

    FlipWindingOrderProcess flipper;
    flipper.Execute(pScene);
}